

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

uint8_t arangodb::velocypack::Builder::intLength(int64_t value)

{
  uint8_t uVar1;
  undefined8 local_28;
  uint8_t xSize;
  uint64_t x;
  int64_t value_local;
  undefined1 local_1;
  
  if ((value < -0x80) || (0x7f < value)) {
    local_28 = value;
    if (value < 0) {
      local_28 = -(value + 1);
    }
    x = local_28;
    xSize = '\0';
    uVar1 = xSize;
    do {
      xSize = uVar1;
      x = x >> 8;
      uVar1 = xSize + '\x01';
    } while (0x7f < x);
    local_1 = xSize + '\x02';
  }
  else {
    local_1 = '\x01';
  }
  return local_1;
}

Assistant:

static inline uint8_t intLength(int64_t value) {
    if (value >= -0x80 && value <= 0x7f) {
      // shortcut for the common case
      return 1;
    }
    uint64_t x = value >= 0 ? static_cast<uint64_t>(value)
                            : static_cast<uint64_t>(-(value + 1));
    uint8_t xSize = 0;
    do {
      xSize++;
      x >>= 8;
    } while (x >= 0x80);
    return xSize + 1;
  }